

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

GLint __thiscall
gl4cts::TextureViewTestViewSampling::getMaxConformantSampleCount
          (TextureViewTestViewSampling *this,GLenum target,GLenum internalFormat)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  ulong uVar6;
  int local_40;
  int local_3c;
  GLint isConformant;
  GLint i;
  GLint *gl_supported_samples;
  long lStack_28;
  GLint gl_sample_counts;
  Functions *gl;
  GLenum local_18;
  GLint max_conformant_samples;
  GLenum internalFormat_local;
  GLenum target_local;
  TextureViewTestViewSampling *this_local;
  
  gl._4_4_ = 0;
  local_18 = internalFormat;
  max_conformant_samples = target;
  _internalFormat_local = this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar3);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_NV_internalformat_sample_query");
  if (bVar2) {
    gl_supported_samples._4_4_ = 0;
    (**(code **)(lStack_28 + 0x880))
              (max_conformant_samples,0x8058,0x9380,1,(long)&gl_supported_samples + 4);
    dVar4 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar4,"glGetInternalformativ() failed for GL_NUM_SAMPLE_COUNTS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x12cb);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)gl_supported_samples._4_4_;
    uVar6 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    _isConformant = operator_new__(uVar6);
    if (_isConformant != (void *)0x0) {
      (**(code **)(lStack_28 + 0x880))
                (max_conformant_samples,0x8058,0x80a9,gl_supported_samples._4_4_,_isConformant);
      for (local_3c = 0; local_3c < gl_supported_samples._4_4_; local_3c = local_3c + 1) {
        local_40 = 0;
        (**(code **)(lStack_28 + 0x870))
                  (max_conformant_samples,0x8058,
                   *(undefined4 *)((long)_isConformant + (long)local_3c * 4),0x9374,1,&local_40);
        dVar4 = (**(code **)(lStack_28 + 0x800))();
        glu::checkError(dVar4,"glGetInternalformatSampleivNV() call(s) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x12d8);
        if ((local_40 != 0) && (gl._4_4_ < *(int *)((long)_isConformant + (long)local_3c * 4))) {
          gl._4_4_ = *(GLint *)((long)_isConformant + (long)local_3c * 4);
        }
      }
      if (_isConformant != (void *)0x0) {
        operator_delete__(_isConformant);
      }
    }
  }
  else {
    (**(code **)(lStack_28 + 0x868))(0x910e,(long)&gl + 4);
    dVar4 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar4,"glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x12e6);
  }
  return gl._4_4_;
}

Assistant:

glw::GLint TextureViewTestViewSampling::getMaxConformantSampleCount(glw::GLenum target, glw::GLenum internalFormat)
{
	(void)internalFormat;
	glw::GLint max_conformant_samples = 0;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return the max conformant sample count if extension is supported */
	if (m_context.getContextInfo().isExtensionSupported("GL_NV_internalformat_sample_query"))
	{
		glw::GLint gl_sample_counts = 0;
		gl.getInternalformativ(target, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 1, &gl_sample_counts);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed for GL_NUM_SAMPLE_COUNTS pname");

		/* Check and return the first conformant sample count */
		glw::GLint* gl_supported_samples = new glw::GLint[gl_sample_counts];
		if (gl_supported_samples)
		{
			gl.getInternalformativ(target, GL_RGBA8, GL_SAMPLES, gl_sample_counts, gl_supported_samples);

			for (glw::GLint i = 0; i < gl_sample_counts; i++)
			{
				glw::GLint isConformant = 0;
				gl.getInternalformatSampleivNV(target, GL_RGBA8, gl_supported_samples[i], GL_CONFORMANT_NV, 1,
											   &isConformant);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformatSampleivNV() call(s) failed");

				if (isConformant && gl_supported_samples[i] > max_conformant_samples)
				{
					max_conformant_samples = gl_supported_samples[i];
				}
			}
			delete[] gl_supported_samples;
		}
	}
	else
	{
		/* Otherwise return GL_MAX_COLOR_TEXTURE_SAMPLES */
		gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &max_conformant_samples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.");
	}

	return max_conformant_samples;
}